

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O1

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::read
          (SamplingStrategyResponse *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  read((SamplingStrategyResponse *)(&this->field_0x0 + *(long *)(*(long *)this + -0x20)),in_ESI,
       in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t SamplingStrategyResponse::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_strategyType = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast14;
          xfer += iprot->readI32(ecast14);
          this->strategyType = (SamplingStrategyType::type)ecast14;
          isset_strategyType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->probabilisticSampling.read(iprot);
          this->__isset.probabilisticSampling = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->rateLimitingSampling.read(iprot);
          this->__isset.rateLimitingSampling = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->operationSampling.read(iprot);
          this->__isset.operationSampling = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_strategyType)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}